

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O3

void xc_mgga_exc_vxc_fxc_kxc
               (xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
               double *zk,double *vrho,double *vsigma,double *vlapl,double *vtau,double *v2rho2,
               double *v2rhosigma,double *v2rholapl,double *v2rhotau,double *v2sigma2,
               double *v2sigmalapl,double *v2sigmatau,double *v2lapl2,double *v2lapltau,
               double *v2tau2,double *v3rho3,double *v3rho2sigma,double *v3rho2lapl,
               double *v3rho2tau,double *v3rhosigma2,double *v3rhosigmalapl,double *v3rhosigmatau,
               double *v3rholapl2,double *v3rholapltau,double *v3rhotau2,double *v3sigma3,
               double *v3sigma2lapl,double *v3sigma2tau,double *v3sigmalapl2,double *v3sigmalapltau,
               double *v3sigmatau2,double *v3lapl3,double *v3lapl2tau,double *v3lapltau2,
               double *v3tau3)

{
  xc_mgga_out_params local_260;
  
  memset(&local_260.v4rho4,0,0x118);
  local_260.zk = zk;
  local_260.vrho = vrho;
  local_260.vsigma = vsigma;
  local_260.vlapl = vlapl;
  local_260.vtau = vtau;
  local_260.v2rho2 = v2rho2;
  local_260.v2rhosigma = v2rhosigma;
  local_260.v2rholapl = v2rholapl;
  local_260.v2rhotau = v2rhotau;
  local_260.v2sigma2 = v2sigma2;
  local_260.v2sigmalapl = v2sigmalapl;
  local_260.v2sigmatau = v2sigmatau;
  local_260.v2lapl2 = v2lapl2;
  local_260.v2lapltau = v2lapltau;
  local_260.v2tau2 = v2tau2;
  local_260.v3rho3 = v3rho3;
  local_260.v3rho2sigma = v3rho2sigma;
  local_260.v3rho2lapl = v3rho2lapl;
  local_260.v3rho2tau = v3rho2tau;
  local_260.v3rhosigma2 = v3rhosigma2;
  local_260.v3rhosigmalapl = v3rhosigmalapl;
  local_260.v3rhosigmatau = v3rhosigmatau;
  local_260.v3rholapl2 = v3rholapl2;
  local_260.v3rholapltau = v3rholapltau;
  local_260.v3rhotau2 = v3rhotau2;
  local_260.v3sigma3 = v3sigma3;
  local_260.v3sigma2lapl = v3sigma2lapl;
  local_260.v3sigma2tau = v3sigma2tau;
  local_260.v3sigmalapl2 = v3sigmalapl2;
  local_260.v3sigmalapltau = v3sigmalapltau;
  local_260.v3sigmatau2 = v3sigmatau2;
  local_260.v3lapl3 = v3lapl3;
  local_260.v3lapl2tau = v3lapl2tau;
  local_260.v3lapltau2 = v3lapltau2;
  local_260.v3tau3 = v3tau3;
  xc_mgga_new(p,3,np,rho,sigma,lapl,tau,&local_260);
  return;
}

Assistant:

void xc_mgga_exc_vxc_fxc_kxc(const xc_func_type *p, size_t np,
                             const double *rho, const double *sigma, const double *lapl, const double *tau,
                             double *zk, double *vrho, double *vsigma, double *vlapl, double *vtau,
                             double *v2rho2, double *v2rhosigma, double *v2rholapl, double *v2rhotau,
                             double *v2sigma2, double *v2sigmalapl, double *v2sigmatau, double *v2lapl2,
                             double *v2lapltau, double *v2tau2,
                             double *v3rho3, double *v3rho2sigma, double *v3rho2lapl, double *v3rho2tau,
                             double *v3rhosigma2, double *v3rhosigmalapl, double *v3rhosigmatau,
                             double *v3rholapl2, double *v3rholapltau, double *v3rhotau2, double *v3sigma3,
                             double *v3sigma2lapl, double *v3sigma2tau, double *v3sigmalapl2, double *v3sigmalapltau,
                             double *v3sigmatau2, double *v3lapl3, double *v3lapl2tau, double *v3lapltau2,
                             double *v3tau3)
{
  xc_mgga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_mgga_out_params));
  SET_ORDER_0;
  SET_ORDER_1;
  SET_ORDER_2;
  SET_ORDER_3;

  xc_mgga_new(p, 3, np, rho, sigma, lapl, tau, &out);
}